

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_char_ptr_is_string.hpp
# Opt level: O2

void mserialize::CustomSerializer<const_char_*,_void>::serialize<binlog::detail::QueueWriter>
               (char *str,QueueWriter *ostream)

{
  string_view local_18;
  
  local_18 = view(str);
  detail::BuiltinSerializer<mserialize::string_view,_void>::serialize<binlog::detail::QueueWriter>
            (&local_18,ostream);
  return;
}

Assistant:

static void serialize(const char* str, OutputStream& ostream)
  {
    mserialize::serialize(view(str), ostream);
  }